

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> * __thiscall
tcb::unicode::detail::unicode_view::operator_cast_to_u16string
          (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
           *__return_storage_ptr__,unicode_view *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::u16string::
  _M_construct<tcb::unicode::detail::unicode_view<__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>,__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>,char32_t,char16_t>::iterator>
            ((u16string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

constexpr operator Container() const
    {
        return Container(begin(), end());
    }